

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerInlineBuiltIn(Lowerer *this,Instr *builtInEndInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_20;
  Instr *startCallInstr;
  Instr *builtInEndInstr_local;
  Lowerer *this_local;
  
  startCallInstr = builtInEndInstr;
  builtInEndInstr_local = (Instr *)this;
  if ((builtInEndInstr->m_opcode != InlineBuiltInEnd) &&
     (builtInEndInstr->m_opcode != InlineNonTrackingBuiltInEnd)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ef9,
                       "(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd)"
                       ,
                       "builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = (Instr *)0x0;
  IR::Instr::IterateArgInstrs<Lowerer::LowerInlineBuiltIn(IR::Instr*)::__0>
            (startCallInstr,(anon_class_8_1_da3b4f2a)&local_20);
  IR::Instr::Unlink(local_20);
  IR::Instr::Remove(startCallInstr);
  return;
}

Assistant:

void Lowerer::LowerInlineBuiltIn(IR::Instr* builtInEndInstr)
{
    Assert(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd);
    IR::Instr* startCallInstr = nullptr;
    builtInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        startCallInstr = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        return false;
    });
    // Keep the startCall around as bailout refers to it. Just unlink it for now - do not delete it.
    startCallInstr->Unlink();
    builtInEndInstr->Remove();
}